

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O2

void __thiscall GrpParser::featureSpecStruct(GrpParser *this)

{
  RefAST *this_00;
  ASTFactory *nodes;
  RefAST RVar1;
  bool bVar2;
  int iVar3;
  ASTArray *pAVar4;
  NoViableAltException *pNVar5;
  AST *pAVar6;
  AST *pAVar7;
  AST *pAVar8;
  RefCount<Token> *this_01;
  AST *pAVar9;
  RefAST tmp160_AST;
  RefAST tmp158_AST;
  RefAST featureSpecStruct_AST;
  undefined1 local_e0 [8];
  RefAST tmp159_AST;
  RefAST X_AST;
  RefCount<AST> local_c8;
  RefAST I_AST;
  ASTFactory local_b8;
  RefCount<Token> local_a8;
  RefCount<Token> local_a0;
  RefToken In;
  RefToken I;
  ASTPair currentAST;
  RefAST local_70;
  RefAST local_68;
  RefAST local_60;
  RefToken local_58;
  RefToken local_50;
  RefToken local_48;
  RefCount<Token> local_40;
  RefCount<Token> local_38;
  
  this_00 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(this_00,&nullAST);
  featureSpecStruct_AST = nullAST;
  currentAST.root.ref = (Ref *)0x0;
  currentAST.child.ref = (Ref *)0x0;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  I.ref = nullToken.ref;
  if (nullToken.ref != (Ref *)0x0) {
    (nullToken.ref)->count = (nullToken.ref)->count + 1;
  }
  if (featureSpecStruct_AST.ref != (Ref *)0x0) {
    (featureSpecStruct_AST.ref)->count = (featureSpecStruct_AST.ref)->count + 1;
  }
  I_AST = featureSpecStruct_AST;
  if (I.ref != (Ref *)0x0) {
    (I.ref)->count = (I.ref)->count + 1;
  }
  In = I;
  if (featureSpecStruct_AST.ref != (Ref *)0x0) {
    (featureSpecStruct_AST.ref)->count = (featureSpecStruct_AST.ref)->count + 2;
  }
  local_c8.ref = featureSpecStruct_AST.ref;
  X_AST = featureSpecStruct_AST;
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 0xd) {
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp158_AST,this,1);
    RefCount<Token>::operator=(&I,(RefCount<Token> *)&tmp158_AST);
    RefCount<Token>::~RefCount((RefCount<Token> *)&tmp158_AST);
    if (I.ref != (Ref *)0x0) {
      (I.ref)->count = (I.ref)->count + 1;
    }
    local_38.ref = I.ref;
    ASTFactory::create((ASTFactory *)&tmp158_AST,
                       (RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
    RefCount<AST>::operator=(&I_AST,&tmp158_AST);
    RefCount<AST>::~RefCount(&tmp158_AST);
    this_01 = &local_38;
  }
  else {
    if (iVar3 != 0x10) {
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_48,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_48);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&tmp158_AST,this,1);
    RefCount<Token>::operator=(&In,(RefCount<Token> *)&tmp158_AST);
    RefCount<Token>::~RefCount((RefCount<Token> *)&tmp158_AST);
    if (In.ref != (Ref *)0x0) {
      (In.ref)->count = (In.ref)->count + 1;
    }
    local_40.ref = In.ref;
    ASTFactory::create((ASTFactory *)&tmp158_AST,
                       (RefToken *)&(this->super_LLkParser).super_Parser.astFactory);
    RefCount<AST>::operator=(&local_c8,&tmp158_AST);
    RefCount<AST>::~RefCount(&tmp158_AST);
    this_01 = &local_40;
  }
  RefCount<Token>::~RefCount(this_01);
  Parser::match((Parser *)this,iVar3);
  tmp158_AST = nullAST;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a0,this,1);
  nodes = &(this->super_LLkParser).super_Parser.astFactory;
  ASTFactory::create((ASTFactory *)&tmp159_AST,(RefToken *)nodes);
  RefCount<AST>::operator=(&tmp158_AST,&tmp159_AST);
  RefCount<AST>::~RefCount(&tmp159_AST);
  RefCount<Token>::~RefCount(&local_a0);
  Parser::match((Parser *)this,0xb);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 - 0x10U < 2) {
LAB_00178189:
    featureSpecList(this);
    RefCount<AST>::operator=(&X_AST,this_00);
  }
  else if (iVar3 != 0xc) {
    if (iVar3 != 0xd) {
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_50,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_50);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    goto LAB_00178189;
  }
  tmp159_AST.ref = nullAST.ref;
  if (nullAST.ref != (Ref *)0x0) {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a8,this,1);
  ASTFactory::create((ASTFactory *)&tmp160_AST,(RefToken *)nodes);
  RefCount<AST>::operator=(&tmp159_AST,&tmp160_AST);
  RefCount<AST>::~RefCount(&tmp160_AST);
  RefCount<Token>::~RefCount(&local_a8);
  Parser::match((Parser *)this,0xc);
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  if (iVar3 == 8) {
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_43,iVar3);
    if (!bVar2) goto LAB_001782b6;
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    RVar1 = nullAST;
    if (!bVar2) goto LAB_001782b6;
    if (nullAST.ref != (Ref *)0x0) {
      (nullAST.ref)->count = (nullAST.ref)->count + 1;
    }
    tmp160_AST = RVar1;
    (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_b8.nodeFactory,this,1);
    ASTFactory::create((ASTFactory *)local_e0,(RefToken *)nodes);
    RefCount<AST>::operator=(&tmp160_AST,(RefCount<AST> *)local_e0);
    RefCount<AST>::~RefCount((RefCount<AST> *)local_e0);
    RefCount<Token>::~RefCount((RefCount<Token> *)&local_b8.nodeFactory);
    Parser::match((Parser *)this,8);
    RefCount<AST>::~RefCount(&tmp160_AST);
  }
  else {
LAB_001782b6:
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
    bVar2 = BitSet::member(&_tokenSet_43,iVar3);
    if (!bVar2) {
LAB_0017853e:
      pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_58,this,1);
      NoViableAltException::NoViableAltException(pNVar5,&local_58);
      __cxa_throw(pNVar5,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException
                 );
    }
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,2);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    if (!bVar2) goto LAB_0017853e;
    iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,3);
    bVar2 = BitSet::member(&_tokenSet_4,iVar3);
    if (!bVar2) goto LAB_0017853e;
  }
  RefCount<AST>::operator=(&featureSpecStruct_AST,&currentAST.root);
  pAVar4 = (ASTArray *)operator_new(0x20);
  ASTArray::ASTArray(pAVar4,4);
  ASTFactory::create(&local_b8,(int)nodes);
  pAVar4 = ASTArray::add(pAVar4,(RefAST *)&local_b8);
  if (I_AST.ref != (Ref *)0x0) {
    (I_AST.ref)->count = (I_AST.ref)->count + 1;
  }
  local_60.ref = I_AST.ref;
  pAVar4 = ASTArray::add(pAVar4,&local_60);
  if (local_c8.ref != (Ref *)0x0) {
    (local_c8.ref)->count = (local_c8.ref)->count + 1;
  }
  local_68.ref = local_c8.ref;
  pAVar4 = ASTArray::add(pAVar4,&local_68);
  if (X_AST.ref != (Ref *)0x0) {
    (X_AST.ref)->count = (X_AST.ref)->count + 1;
  }
  local_70.ref = X_AST.ref;
  ASTArray::add(pAVar4,&local_70);
  ASTFactory::make((ASTFactory *)&tmp160_AST,(ASTArray *)nodes);
  RefCount<AST>::operator=(&featureSpecStruct_AST,&tmp160_AST);
  RefCount<AST>::~RefCount(&tmp160_AST);
  RefCount<AST>::~RefCount(&local_70);
  RefCount<AST>::~RefCount(&local_68);
  RefCount<AST>::~RefCount(&local_60);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_b8);
  RefCount<AST>::operator=(&currentAST.root,&featureSpecStruct_AST);
  if (featureSpecStruct_AST.ref == (Ref *)0x0) {
    pAVar9 = (AST *)0x0;
  }
  else {
    pAVar9 = (featureSpecStruct_AST.ref)->ptr;
  }
  if (nullAST.ref == (Ref *)0x0) {
    pAVar8 = (AST *)0x0;
  }
  else {
    pAVar8 = (nullAST.ref)->ptr;
  }
  if (pAVar9 != pAVar8) {
    AST::getFirstChild((featureSpecStruct_AST.ref)->ptr);
    if (local_e0 == (undefined1  [8])0x0) {
      pAVar6 = (AST *)0x0;
    }
    else {
      pAVar6 = *(AST **)local_e0;
    }
    if (nullAST.ref == (Ref *)0x0) {
      pAVar7 = (AST *)0x0;
    }
    else {
      pAVar7 = (nullAST.ref)->ptr;
    }
    if (pAVar6 != pAVar7) {
      AST::getFirstChild((featureSpecStruct_AST.ref)->ptr);
      goto LAB_00178497;
    }
  }
  if (featureSpecStruct_AST.ref != (Ref *)0x0) {
    (featureSpecStruct_AST.ref)->count = (featureSpecStruct_AST.ref)->count + 1;
  }
  tmp160_AST = featureSpecStruct_AST;
LAB_00178497:
  RefCount<AST>::operator=(&currentAST.child,&tmp160_AST);
  RefCount<AST>::~RefCount(&tmp160_AST);
  if (pAVar9 != pAVar8) {
    RefCount<AST>::~RefCount((RefCount<AST> *)local_e0);
  }
  ASTPair::advanceChildToEnd(&currentAST);
  RefCount<AST>::~RefCount(&tmp159_AST);
  RefCount<AST>::~RefCount(&tmp158_AST);
  RefCount<AST>::operator=(this_00,&featureSpecStruct_AST);
  RefCount<AST>::~RefCount(&X_AST);
  RefCount<AST>::~RefCount(&local_c8);
  RefCount<Token>::~RefCount(&In);
  RefCount<AST>::~RefCount(&I_AST);
  RefCount<Token>::~RefCount(&I);
  RefCount<AST>::~RefCount(&featureSpecStruct_AST);
  ASTPair::~ASTPair(&currentAST);
  return;
}

Assistant:

void GrpParser::featureSpecStruct() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST featureSpecStruct_AST = nullAST;
	RefToken  I = nullToken;
	RefAST I_AST = nullAST;
	RefToken  In = nullToken;
	RefAST In_AST = nullAST;
	RefAST X_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case IDENT:
		{
			I = LT(1);
			I_AST = astFactory.create(I);
			match(IDENT);
			break;
		}
		case LITERAL_name:
		{
			In = LT(1);
			In_AST = astFactory.create(In);
			match(LITERAL_name);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp158_AST = nullAST;
		tmp158_AST = astFactory.create(LT(1));
		match(OP_LBRACE);
		{
		switch ( LA(1)) {
		case IDENT:
		case LITERAL_name:
		case LIT_INT:
		{
			featureSpecList();
			X_AST = returnAST;
			break;
		}
		case OP_RBRACE:
		{
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		RefAST tmp159_AST = nullAST;
		tmp159_AST = astFactory.create(LT(1));
		match(OP_RBRACE);
		{
		if ((LA(1)==OP_SEMI) && (_tokenSet_43.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
			RefAST tmp160_AST = nullAST;
			tmp160_AST = astFactory.create(LT(1));
			match(OP_SEMI);
		}
		else if ((_tokenSet_43.member(LA(1))) && (_tokenSet_4.member(LA(2))) && (_tokenSet_4.member(LA(3)))) {
		}
		else {
			throw NoViableAltException(LT(1));
		}
		
		}
		featureSpecStruct_AST = currentAST.root;
		featureSpecStruct_AST = astFactory.make( (new ASTArray(4))->add(astFactory.create(ZdotStruct))->add(I_AST)->add(In_AST)->add(X_AST));
		currentAST.root = featureSpecStruct_AST;
		currentAST.child = featureSpecStruct_AST!=nullAST &&featureSpecStruct_AST->getFirstChild()!=nullAST ?
			featureSpecStruct_AST->getFirstChild() : featureSpecStruct_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_43);
	}
	returnAST = featureSpecStruct_AST;
}